

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void(std::error_code_const&)>::callback<void(*)(std::error_code_const&)>
          (callback<void(std::error_code_const&)> *this,_func_void_error_code_ptr *func)

{
  callable_impl<void,_void_(*)(const_std::error_code_&)> *this_00;
  
  this_00 = (callable_impl<void,_void_(*)(const_std::error_code_&)> *)operator_new(0x18);
  callback<void_(const_std::error_code_&)>::callable_impl<void,_void_(*)(const_std::error_code_&)>::
  callable_impl(this_00,func);
  *(callable_impl<void,_void_(*)(const_std::error_code_&)> **)this = this_00;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}